

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sqlite3VdbeMemCast(Mem *pMem,u8 aff,u8 encoding)

{
  undefined2 uVar1;
  undefined2 uVar2;
  ushort uVar3;
  int iVar4;
  i64 iVar5;
  double dVar6;
  
  uVar3 = pMem->flags;
  if ((uVar3 & 1) != 0) {
    return 0;
  }
  switch(aff) {
  case 'A':
    if ((uVar3 & 0x10) == 0) {
      applyAffinity(pMem,'B',encoding);
      if ((pMem->flags & 2) == 0) {
        return 0;
      }
      uVar3 = pMem->flags & 0xf240 | 0x10;
    }
    else {
      uVar3 = uVar3 & 0xf250;
    }
    break;
  default:
    pMem->flags = uVar3 >> 3 & 2 | uVar3;
    applyAffinity(pMem,'B',encoding);
    uVar3 = pMem->flags;
    pMem->flags = uVar3 & 0xfbc3;
    if (encoding == '\x01') {
      if ((uVar3 & 2) == 0) {
        pMem->enc = '\x01';
        goto LAB_0014ac4b;
      }
      encoding = '\x01';
      if (pMem->enc == '\x01') goto LAB_0014ac4b;
    }
    else {
      *(byte *)&pMem->n = (byte)pMem->n & 0xfe;
      if ((uVar3 & 2) == 0) {
        pMem->enc = encoding;
        goto LAB_0014ac4b;
      }
      if (pMem->enc == encoding) goto LAB_0014ac4b;
    }
    iVar4 = sqlite3VdbeMemTranslate(pMem,encoding);
    if (iVar4 != 0) {
      return iVar4;
    }
LAB_0014ac4b:
    sqlite3VdbeMemZeroTerminateIfAble(pMem);
    return 0;
  case 'C':
    sqlite3VdbeMemNumerify(pMem);
    return 0;
  case 'D':
    iVar5 = sqlite3VdbeIntValue(pMem);
    (pMem->u).i = iVar5;
    uVar1 = pMem->flags;
    uVar3 = uVar1 & 0xf240 | 4;
    break;
  case 'E':
    dVar6 = sqlite3VdbeRealValue(pMem);
    (pMem->u).r = dVar6;
    uVar2 = pMem->flags;
    uVar3 = uVar2 & 0xf240 | 8;
  }
  pMem->flags = uVar3;
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeMemCast(Mem *pMem, u8 aff, u8 encoding){
  if( pMem->flags & MEM_Null ) return SQLITE_OK;
  switch( aff ){
    case SQLITE_AFF_BLOB: {   /* Really a cast to BLOB */
      if( (pMem->flags & MEM_Blob)==0 ){
        sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
        assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
        if( pMem->flags & MEM_Str ) MemSetTypeFlag(pMem, MEM_Blob);
      }else{
        pMem->flags &= ~(MEM_TypeMask&~MEM_Blob);
      }
      break;
    }
    case SQLITE_AFF_NUMERIC: {
      sqlite3VdbeMemNumerify(pMem);
      break;
    }
    case SQLITE_AFF_INTEGER: {
      sqlite3VdbeMemIntegerify(pMem);
      break;
    }
    case SQLITE_AFF_REAL: {
      sqlite3VdbeMemRealify(pMem);
      break;
    }
    default: {
      int rc;
      assert( aff==SQLITE_AFF_TEXT );
      assert( MEM_Str==(MEM_Blob>>3) );
      pMem->flags |= (pMem->flags&MEM_Blob)>>3;
      sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
      assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
      pMem->flags &= ~(MEM_Int|MEM_Real|MEM_IntReal|MEM_Blob|MEM_Zero);
      if( encoding!=SQLITE_UTF8 ) pMem->n &= ~1;
      rc = sqlite3VdbeChangeEncoding(pMem, encoding);
      if( rc ) return rc;
      sqlite3VdbeMemZeroTerminateIfAble(pMem);
    }
  }
  return SQLITE_OK;
}